

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport.cpp
# Opt level: O0

MockSupport * mock(SimpleString *mockName,MockFailureReporter *failureReporterForThisCall)

{
  bool bVar1;
  MockSupport *local_60;
  SimpleString local_30;
  MockSupport *local_20;
  MockSupport *mock_support;
  MockFailureReporter *failureReporterForThisCall_local;
  SimpleString *mockName_local;
  
  mock_support = (MockSupport *)failureReporterForThisCall;
  failureReporterForThisCall_local = (MockFailureReporter *)mockName;
  SimpleString::SimpleString(&local_30,"");
  bVar1 = operator!=(mockName,&local_30);
  if (bVar1) {
    local_60 = MockSupport::getMockSupportScope
                         (&global_mock,(SimpleString *)failureReporterForThisCall_local);
  }
  else {
    local_60 = &global_mock;
  }
  SimpleString::~SimpleString(&local_30);
  local_20 = local_60;
  (*local_60->_vptr_MockSupport[0x2a])(local_60,mock_support);
  (*local_20->_vptr_MockSupport[0x2b])();
  return local_20;
}

Assistant:

MockSupport& mock(const SimpleString& mockName, MockFailureReporter* failureReporterForThisCall)
{
    MockSupport& mock_support = (mockName != "") ? *global_mock.getMockSupportScope(mockName) : global_mock;
    mock_support.setActiveReporter(failureReporterForThisCall);
    mock_support.setDefaultComparatorsAndCopiersRepository();
    return mock_support;
}